

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

void __thiscall Symbol_Table::set_data(Symbol_Table *this,string *name,string *type,string *kind)

{
  int iVar1;
  bool bVar2;
  IdentifierData *this_00;
  mapped_type *ppIVar3;
  IdentifierData *identifier_data;
  string *kind_local;
  string *type_local;
  string *name_local;
  Symbol_Table *this_local;
  
  this_00 = (IdentifierData *)operator_new(0x48);
  IdentifierData::IdentifierData(this_00);
  std::__cxx11::string::operator=((string *)this_00,(string *)type);
  std::__cxx11::string::operator=((string *)&this_00->kind,(string *)kind);
  bVar2 = std::operator==(kind,"ARG");
  if ((bVar2) || (bVar2 = std::operator==(kind,"VAR"), bVar2)) {
    ppIVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
              ::operator[](&this->subroutine_scope,name);
    *ppIVar3 = this_00;
    bVar2 = std::operator==(kind,"ARG");
    if (bVar2) {
      iVar1 = this->arg_count;
      this->arg_count = iVar1 + 1;
      this_00->index = iVar1;
    }
    else {
      iVar1 = this->var_count;
      this->var_count = iVar1 + 1;
      this_00->index = iVar1;
    }
  }
  else {
    ppIVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
              ::operator[](&this->class_scope,name);
    *ppIVar3 = this_00;
    bVar2 = std::operator==(kind,"FIELD");
    if (bVar2) {
      iVar1 = this->field_count;
      this->field_count = iVar1 + 1;
      this_00->index = iVar1;
    }
    else {
      iVar1 = this->static_count;
      this->static_count = iVar1 + 1;
      this_00->index = iVar1;
    }
  }
  return;
}

Assistant:

void Symbol_Table::set_data(const std::string& name, const std::string& type, const std::string& kind) {
    auto *identifier_data = new IdentifierData;
    identifier_data->type = type;
    identifier_data->kind = kind;

    if (kind == "ARG" || kind == "VAR") {
        subroutine_scope[name] = identifier_data;
        if (kind == "ARG") {
            identifier_data->index = arg_count++;
        }
        else {
            identifier_data->index = var_count++;
        }
    }
    else {
        class_scope[name] = identifier_data;
        if (kind == "FIELD") {
            identifier_data->index = field_count++;
        }
        else {
            identifier_data->index = static_count++;
        }
    }
}